

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionCommand.cxx
# Opt level: O2

bool __thiscall
cmFunctionHelperCommand::InvokeInitialPass
          (cmFunctionHelperCommand *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *inStatus)

{
  cmMakefile *pcVar1;
  pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  ostream *poVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  cmExecutionStatus status;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expandedArgs;
  string argnDef;
  FunctionPushPop functionScope;
  string argvDef;
  ostringstream strStream;
  allocator local_399;
  undefined1 local_398 [8];
  const_iterator local_390;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  string local_358;
  cmExecutionStatus *local_338;
  FunctionPushPop local_330;
  string local_320 [11];
  string local_1a8 [11];
  
  local_378.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::ExpandArguments((this->super_cmCommand).Makefile,args,&local_378,(char *)0x0);
  if ((ulong)((long)local_378.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_378.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) <
      ((long)(this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
    std::__cxx11::string::string
              ((string *)local_1a8,"Function invoked with incorrect arguments for function named: ",
               (allocator *)local_320);
    std::__cxx11::string::append((string *)local_1a8);
    cmCommand::SetError(&this->super_cmCommand,local_1a8);
    std::__cxx11::string::~string((string *)local_1a8);
    bVar6 = false;
  }
  else {
    cmMakefile::FunctionPushPop::FunctionPushPop
              (&local_330,(this->super_cmCommand).Makefile,&this->FilePath,&this->Policies);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string((string *)local_320,"ARGC",(allocator *)local_398);
    std::__cxx11::stringbuf::str();
    cmMakefile::AddDefinition(pcVar1,local_320,local_358._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)local_320);
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string((string *)local_320,"ARGC",(allocator *)&local_358);
    local_338 = inStatus;
    cmMakefile::MarkVariableAsUsed(pcVar1,local_320);
    std::__cxx11::string::~string((string *)local_320);
    for (uVar7 = 0;
        (ulong)uVar7 <
        (ulong)((long)local_378.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_378.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
      poVar5 = std::operator<<((ostream *)local_320,"ARGV");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::AddDefinition
                (pcVar1,&local_358,
                 local_378.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_358);
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::MarkVariableAsUsed(pcVar1,&local_358);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    }
    uVar7 = 0;
    while( true ) {
      uVar8 = uVar7 + 1;
      pbVar2 = (this->Args).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->Args).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <=
          (ulong)uVar8) break;
      cmMakefile::AddDefinition
                ((this->super_cmCommand).Makefile,pbVar2 + uVar8,
                 local_378.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p);
      uVar7 = uVar8;
    }
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (local_320,&local_378,";");
    local_398 = (undefined1  [8])
                ((long)local_378.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                (long)(this->Args).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish +
                (-0x20 - (long)(this->Args).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start));
    local_390._M_current =
         local_378.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&local_358,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_398,";");
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string((string *)local_398,"ARGV",&local_399);
    cmMakefile::AddDefinition(pcVar1,(string *)local_398,local_320[0]._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)local_398);
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string((string *)local_398,"ARGV",&local_399);
    cmMakefile::MarkVariableAsUsed(pcVar1,(string *)local_398);
    std::__cxx11::string::~string((string *)local_398);
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string((string *)local_398,"ARGN",&local_399);
    cmMakefile::AddDefinition(pcVar1,(string *)local_398,local_358._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)local_398);
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string((string *)local_398,"ARGN",&local_399);
    cmMakefile::MarkVariableAsUsed(pcVar1,(string *)local_398);
    std::__cxx11::string::~string((string *)local_398);
    uVar7 = 0;
    do {
      pcVar3 = (this->Functions).
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar6 = true;
      if ((ulong)((long)(this->Functions).
                        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pcVar3 >> 6) <=
          (ulong)uVar7) break;
      local_398 = (undefined1  [8])((ulong)local_398 & 0xffffffff00000000);
      bVar4 = cmMakefile::ExecuteCommand
                        ((this->super_cmCommand).Makefile,pcVar3 + uVar7,
                         (cmExecutionStatus *)local_398);
      if ((!bVar4) || (local_398[3] == true)) {
        local_330.ReportError = false;
        local_338->NestedError = true;
        bVar6 = false;
        break;
      }
      uVar7 = uVar7 + 1;
    } while (local_398[0] != (allocator)0x1);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)local_320);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    cmMakefile::FunctionPushPop::~FunctionPushPop(&local_330);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_378);
  return bVar6;
}

Assistant:

bool cmFunctionHelperCommand::InvokeInitialPass
(const std::vector<cmListFileArgument>& args,
 cmExecutionStatus & inStatus)
{
  // Expand the argument list to the function.
  std::vector<std::string> expandedArgs;
  this->Makefile->ExpandArguments(args, expandedArgs);

  // make sure the number of arguments passed is at least the number
  // required by the signature
  if (expandedArgs.size() < this->Args.size() - 1)
    {
    std::string errorMsg =
      "Function invoked with incorrect arguments for function named: ";
    errorMsg += this->Args[0];
    this->SetError(errorMsg);
    return false;
    }

  cmMakefile::FunctionPushPop functionScope(this->Makefile,
                                            this->FilePath,
                                            this->Policies);

  // set the value of argc
  std::ostringstream strStream;
  strStream << expandedArgs.size();
  this->Makefile->AddDefinition("ARGC",strStream.str().c_str());
  this->Makefile->MarkVariableAsUsed("ARGC");

  // set the values for ARGV0 ARGV1 ...
  for (unsigned int t = 0; t < expandedArgs.size(); ++t)
    {
    std::ostringstream tmpStream;
    tmpStream << "ARGV" << t;
    this->Makefile->AddDefinition(tmpStream.str(),
                                  expandedArgs[t].c_str());
    this->Makefile->MarkVariableAsUsed(tmpStream.str());
    }

  // define the formal arguments
  for (unsigned int j = 1; j < this->Args.size(); ++j)
    {
    this->Makefile->AddDefinition(this->Args[j],
                                  expandedArgs[j-1].c_str());
    }

  // define ARGV and ARGN
  std::string argvDef = cmJoin(expandedArgs, ";");
  std::vector<std::string>::const_iterator eit
      = expandedArgs.begin() + (this->Args.size()-1);
  std::string argnDef = cmJoin(cmMakeRange(eit, expandedArgs.end()), ";");
  this->Makefile->AddDefinition("ARGV", argvDef.c_str());
  this->Makefile->MarkVariableAsUsed("ARGV");
  this->Makefile->AddDefinition("ARGN", argnDef.c_str());
  this->Makefile->MarkVariableAsUsed("ARGN");

  // Invoke all the functions that were collected in the block.
  // for each function
  for(unsigned int c = 0; c < this->Functions.size(); ++c)
    {
    cmExecutionStatus status;
    if (!this->Makefile->ExecuteCommand(this->Functions[c],status) ||
        status.GetNestedError())
      {
      // The error message should have already included the call stack
      // so we do not need to report an error here.
      functionScope.Quiet();
      inStatus.SetNestedError(true);
      return false;
      }
    if (status.GetReturnInvoked())
      {
      return true;
      }
    }

  // pop scope on the makefile
  return true;
}